

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

StackPage * __thiscall Lodtalk::StackMemory::allocatePage(StackMemory *this)

{
  bool bVar1;
  reference ppSVar2;
  StackPage *local_20;
  StackPage *leastUsed;
  StackPage *page;
  StackMemory *this_local;
  
  leastUsed = (StackPage *)0x0;
  page = (StackPage *)this;
  bVar1 = std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::empty
                    (&this->freePages);
  if (bVar1) {
    for (local_20 = this->currentPage; local_20->previousPage != (StackPage *)0x0;
        local_20 = local_20->previousPage) {
    }
    StackPage::divorceAllFrames(local_20);
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
              (&this->freePages,&local_20);
  }
  bVar1 = std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::empty
                    (&this->freePages);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppSVar2 = std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::back
                        (&this->freePages);
    leastUsed = *ppSVar2;
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::pop_back
              (&this->freePages);
    leastUsed->previousPage = (StackPage *)0x0;
    leastUsed->nextPage = (StackPage *)0x0;
    return leastUsed;
  }
  __assert_fail("!freePages.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0xca,"StackPage *Lodtalk::StackMemory::allocatePage()");
}

Assistant:

StackPage *StackMemory::allocatePage()
{
    StackPage *page = nullptr;
    if (freePages.empty())
    {
        // Find the least used page
        auto leastUsed = currentPage;
        for (; leastUsed->previousPage; leastUsed = leastUsed->previousPage)
            ;

        leastUsed->divorceAllFrames();
        freePages.push_back(leastUsed);
   }

    assert(!freePages.empty());
    page = freePages.back();
    freePages.pop_back();

    page->previousPage = nullptr;
    page->nextPage = nullptr;
    return page;
}